

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
applyOnTheRight<double>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *this,
          Index p,Index q,JacobiRotation<double> *j)

{
  JacobiRotation<double> local_c8;
  undefined1 local_b8 [8];
  ColXpr y;
  ColXpr x;
  JacobiRotation<double> *j_local;
  Index q_local;
  Index p_local;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *this_local;
  
  DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::col
            ((ColXpr *)
             &y.
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
              .m_outerStride,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             this,p);
  DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::col
            ((ColXpr *)local_b8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             this,q);
  local_c8 = JacobiRotation<double>::transpose(j);
  internal::
  apply_rotation_in_the_plane<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>,double>
            ((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
              *)&y.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                 .m_outerStride,
             (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
              *)local_b8,&local_c8);
  return;
}

Assistant:

inline void MatrixBase<Derived>::applyOnTheRight(Index p, Index q, const JacobiRotation<OtherScalar>& j)
{
  ColXpr x(this->col(p));
  ColXpr y(this->col(q));
  internal::apply_rotation_in_the_plane(x, y, j.transpose());
}